

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void basic_suite::test_long_double(void)

{
  bool bVar1;
  size_t sVar2;
  basic_reader<char> *self;
  unkbyte10 in_ST0;
  char input [4];
  reader reader;
  ulong local_180;
  view_type local_178;
  char local_15c [4];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_15c,"1.0",4);
  sVar2 = strlen(local_15c);
  local_178._M_len._0_4_ = (value)sVar2;
  local_178._M_len._4_4_ = (undefined4)(sVar2 >> 0x20);
  local_178._M_str._0_2_ = SUB82(local_15c,0);
  local_178._M_str._2_6_ = (undefined6)((ulong)local_15c >> 0x10);
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_178);
  local_178._M_len._0_4_ = local_158.decoder.current.code;
  local_180 = CONCAT44(local_180._4_4_,9);
  self = (basic_reader<char> *)0x1179c5;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xa5,"void basic_suite::test_long_double()",&local_178,&local_180);
  trial::protocol::json::basic_reader<char>::overloader<long_double,_void>::value
            ((longdouble *)&local_158,self);
  local_178._M_len._0_4_ = (value)in_ST0;
  local_178._M_len._4_4_ = (undefined4)((unkuint10)in_ST0 >> 0x20);
  local_178._M_str._0_2_ = (undefined2)((unkuint10)in_ST0 >> 0x40);
  local_180 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,double>
            ("reader.value<long double>()","1.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xa6,"void basic_suite::test_long_double()",&local_178,&local_180);
  local_178._M_len._0_4_ =
       trial::protocol::json::basic_reader<char>::overloader<int,_void>::value(&local_158);
  local_180 = CONCAT44(local_180._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xa7,"void basic_suite::test_long_double()",&local_178,&local_180);
  local_178._M_len =
       (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
  local_178._M_str._0_2_ = SUB82(local_158.decoder.current.view.head,0);
  local_178._M_str._2_6_ = (undefined6)((ulong)local_158.decoder.current.view.head >> 0x10);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[4]>
            ("reader.literal()","\"1.0\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xa8,"void basic_suite::test_long_double()",&local_178,"1.0");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
  local_178._M_len._0_4_ = CONCAT31(local_178._M_len._1_3_,bVar1);
  local_180 = local_180 & 0xffffffffffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xa9,"void basic_suite::test_long_double()",&local_178,&local_180);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_158.stack);
  return;
}

Assistant:

void test_long_double()
{
    const char input[] = "1.0";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::real);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<long double>(), 1.0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "1.0");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
}